

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::PsbtGlobalXpubInput::PsbtGlobalXpubInput(PsbtGlobalXpubInput *this)

{
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  PsbtGlobalXpubInput *local_10;
  PsbtGlobalXpubInput *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::PsbtGlobalXpubInput>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::PsbtGlobalXpubInput>);
  (this->super_JsonClassBase<cfd::js::api::json::PsbtGlobalXpubInput>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PsbtGlobalXpubInput_01b4a110;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->descriptor_xpub_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->xpub_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->master_fingerprint_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->path_,"",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  CollectFieldName();
  return;
}

Assistant:

PsbtGlobalXpubInput() {
    CollectFieldName();
  }